

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O3

wchar_t sftp_cmd_chmod(sftp_command *cmd)

{
  byte bVar1;
  _Bool _Var2;
  size_t sVar3;
  uint uVar4;
  wchar_t wVar5;
  char *pcVar6;
  uint uVar7;
  byte *pbVar8;
  byte *__s;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  undefined8 local_38;
  
  if (backend == (Backend *)0x0) {
    pcVar6 = "psftp: not connected to a host; use \"open host.name\"";
  }
  else {
    uVar11 = cmd->nwords;
    if (2 < uVar11) {
      local_38 = 0;
      __s = (byte *)cmd->words[1];
      bVar9 = *__s;
      if ((byte)(bVar9 - 0x30) < 10) {
        sVar3 = strspn((char *)__s,"01234567");
        if (__s[sVar3] != 0) {
          pcVar6 = "chmod: numeric file modes should contain digits 0-7 only";
          goto LAB_0011180c;
        }
        local_38._0_4_ = 0xfff;
        __isoc99_sscanf(__s,"%o",(long)&local_38 + 4);
        local_38 = CONCAT44(local_38._4_4_ & (uint)local_38,(uint)local_38);
        uVar11 = cmd->nwords;
LAB_001119f1:
        if (uVar11 < 3) {
          return L'\x01';
        }
      }
      else if (bVar9 != 0) {
        uVar12 = 0;
        uVar7 = 0;
LAB_00111849:
        uVar10 = 0;
        pbVar8 = __s;
        do {
          pbVar8 = pbVar8 + 1;
          uVar4 = (uint)bVar9;
          if (bVar9 < 0x6f) {
            if (bVar9 == 0x61) {
              uVar4 = 0xdff;
            }
            else {
              if (uVar4 != 0x67) goto LAB_00111899;
              uVar4 = 0x438;
            }
          }
          else if (bVar9 == 0x6f) {
            uVar4 = 7;
          }
          else {
            uVar4 = 0x9c0;
            if (bVar9 != 0x75) goto LAB_00111a95;
          }
          uVar10 = uVar10 | uVar4;
          bVar9 = *pbVar8;
        } while( true );
      }
      wVar5 = L'\x01';
      uVar11 = 2;
      do {
        _Var2 = wildcard_iterate(cmd->words[uVar11],sftp_action_chmod,&local_38);
        if (!_Var2) {
          wVar5 = L'\0';
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < cmd->nwords);
      return wVar5;
    }
    pcVar6 = "chmod: expects a mode specifier and a filename";
  }
LAB_0011180c:
  puts(pcVar6);
  return L'\0';
switchD_001118e5_default:
  if ((bVar1 != 0) && (bVar1 != 0x2c)) {
switchD_001118e5_caseD_75:
    sVar3 = strcspn((char *)__s,",");
    uVar7 = (uint)sVar3;
    pcVar6 = "chmod: file mode \'%.*s\' contains unrecognised permission specifier \'%c\'\n";
    bVar9 = bVar1;
    goto LAB_00111aaf;
  }
  if (((uVar10 & 0xdff) == 0) && ((uVar13 & ~uVar10) != 0)) {
    sVar3 = strcspn((char *)__s,",");
    uVar7 = (uint)sVar3;
    pcVar6 = 
    "chmod: file mode \'%.*s\' contains no user/group/other specifier and permissions other than \'t\' \n"
    ;
    goto LAB_00111a66;
  }
  uVar13 = uVar13 & uVar10;
  if (bVar9 == 0x3d) {
LAB_001119a4:
    uVar7 = uVar7 | uVar13;
    uVar13 = uVar10;
  }
  else {
    if (uVar4 != 0x2d) {
      uVar10 = uVar13;
      if (bVar9 != 0x2b) goto LAB_001119ac;
      goto LAB_001119a4;
    }
    uVar7 = uVar7 & ~uVar13;
  }
  uVar12 = uVar12 | uVar13;
  local_38 = CONCAT44(uVar7,uVar12);
LAB_001119ac:
  __s = pbVar8 + (*pbVar8 != 0);
  bVar9 = *__s;
  if (bVar9 == 0) goto LAB_001119f1;
  goto LAB_00111849;
LAB_00111899:
  if (0x3d < uVar4) {
LAB_00111a95:
    sVar3 = strcspn((char *)__s,",");
    uVar7 = (uint)sVar3;
    pcVar6 = "chmod: file mode \'%.*s\' contains unrecognised user/group/other specifier \'%c\'\n";
LAB_00111aaf:
    printf(pcVar6,(ulong)uVar7,__s,(ulong)(uint)(int)(char)bVar9);
    return L'\0';
  }
  if ((0x2000280000000000U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
    if ((0x100000000001U >> ((ulong)uVar4 & 0x3f) & 1) == 0) goto LAB_00111a95;
  }
  else {
    bVar1 = *pbVar8;
    if ((bVar1 != 0) && (bVar1 != 0x2c)) {
      uVar13 = 0;
      do {
        switch(bVar1) {
        case 0x72:
          uVar13 = uVar13 | 0x124;
          break;
        case 0x73:
          if (((uVar10 & 0xdff) != 0x438) && ((uVar10 & 0xdff) != 0x9c0)) {
            sVar3 = strcspn((char *)__s,",");
            uVar7 = (uint)sVar3;
            pcVar6 = 
            "chmod: file mode \'%.*s\': set[ug]id bit should be used with exactly one of u or g only\n"
            ;
            goto LAB_00111a66;
          }
          uVar13 = uVar13 | 0xc00;
          break;
        case 0x74:
          uVar13 = uVar13 | 0x200;
          uVar10 = uVar10 | 0x200;
          break;
        case 0x75:
        case 0x76:
          goto switchD_001118e5_caseD_75;
        case 0x77:
          uVar13 = uVar13 | 0x92;
          break;
        case 0x78:
          uVar13 = uVar13 | 0x49;
          break;
        default:
          goto switchD_001118e5_default;
        }
        bVar1 = pbVar8[1];
        pbVar8 = pbVar8 + 1;
      } while( true );
    }
  }
  sVar3 = strcspn((char *)__s,",");
  uVar7 = (uint)sVar3;
  pcVar6 = "chmod: file mode \'%.*s\' is incomplete\n";
LAB_00111a66:
  printf(pcVar6,(ulong)uVar7,__s);
  return L'\0';
}

Assistant:

int sftp_cmd_chmod(struct sftp_command *cmd)
{
    char *mode;
    int i, ret;
    struct sftp_context_chmod ctx[1];

    if (!backend) {
        not_connected();
        return 0;
    }

    if (cmd->nwords < 3) {
        printf("chmod: expects a mode specifier and a filename\n");
        return 0;
    }

    /*
     * Attempt to parse the mode specifier in cmd->words[1]. We
     * don't support the full horror of Unix chmod; instead we
     * support a much simpler syntax in which the user can either
     * specify an octal number, or a comma-separated sequence of
     * [ugoa]*[-+=][rwxst]+. (The initial [ugoa] sequence may
     * _only_ be omitted if the only attribute mentioned is t,
     * since all others require a user/group/other specification.
     * Additionally, the s attribute may not be specified for any
     * [ugoa] specifications other than exactly u or exactly g.
     */
    ctx->attrs_clr = ctx->attrs_xor = 0;
    mode = cmd->words[1];
    if (mode[0] >= '0' && mode[0] <= '9') {
        if (mode[strspn(mode, "01234567")]) {
            printf("chmod: numeric file modes should"
                   " contain digits 0-7 only\n");
            return 0;
        }
        ctx->attrs_clr = 07777;
        sscanf(mode, "%o", &ctx->attrs_xor);
        ctx->attrs_xor &= ctx->attrs_clr;
    } else {
        while (*mode) {
            char *modebegin = mode;
            unsigned subset, perms;
            int action;

            subset = 0;
            while (*mode && *mode != ',' &&
                   *mode != '+' && *mode != '-' && *mode != '=') {
                switch (*mode) {
                  case 'u': subset |= 04700; break; /* setuid, user perms */
                  case 'g': subset |= 02070; break; /* setgid, group perms */
                  case 'o': subset |= 00007; break; /* just other perms */
                  case 'a': subset |= 06777; break; /* all of the above */
                  default:
                    printf("chmod: file mode '%.*s' contains unrecognised"
                           " user/group/other specifier '%c'\n",
                           (int)strcspn(modebegin, ","), modebegin, *mode);
                    return 0;
                }
                mode++;
            }
            if (!*mode || *mode == ',') {
                printf("chmod: file mode '%.*s' is incomplete\n",
                       (int)strcspn(modebegin, ","), modebegin);
                return 0;
            }
            action = *mode++;
            if (!*mode || *mode == ',') {
                printf("chmod: file mode '%.*s' is incomplete\n",
                       (int)strcspn(modebegin, ","), modebegin);
                return 0;
            }
            perms = 0;
            while (*mode && *mode != ',') {
                switch (*mode) {
                  case 'r': perms |= 00444; break;
                  case 'w': perms |= 00222; break;
                  case 'x': perms |= 00111; break;
                  case 't': perms |= 01000; subset |= 01000; break;
                  case 's':
                    if ((subset & 06777) != 04700 &&
                        (subset & 06777) != 02070) {
                        printf("chmod: file mode '%.*s': set[ug]id bit should"
                               " be used with exactly one of u or g only\n",
                               (int)strcspn(modebegin, ","), modebegin);
                        return 0;
                    }
                    perms |= 06000;
                    break;
                  default:
                    printf("chmod: file mode '%.*s' contains unrecognised"
                           " permission specifier '%c'\n",
                           (int)strcspn(modebegin, ","), modebegin, *mode);
                    return 0;
                }
                mode++;
            }
            if (!(subset & 06777) && (perms &~ subset)) {
                printf("chmod: file mode '%.*s' contains no user/group/other"
                       " specifier and permissions other than 't' \n",
                       (int)strcspn(modebegin, ","), modebegin);
                return 0;
            }
            perms &= subset;
            switch (action) {
              case '+':
                ctx->attrs_clr |= perms;
                ctx->attrs_xor |= perms;
                break;
              case '-':
                ctx->attrs_clr |= perms;
                ctx->attrs_xor &= ~perms;
                break;
              case '=':
                ctx->attrs_clr |= subset;
                ctx->attrs_xor |= perms;
                break;
            }
            if (*mode) mode++;         /* eat comma */
        }
    }

    ret = 1;
    for (i = 2; i < cmd->nwords; i++)
        ret &= wildcard_iterate(cmd->words[i], sftp_action_chmod, ctx);

    return ret;
}